

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

int xmlSchemaCheckUnionTypeDefCircularRecur
              (xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr ctxType,xmlSchemaTypeLinkPtr members)

{
  byte *pbVar1;
  int iVar2;
  xmlSchemaTypePtr pxVar3;
  xmlSchemaTypeLinkPtr members_00;
  xmlSchemaTypePtr pxVar4;
  
  if (members != (xmlSchemaTypeLinkPtr)0x0) {
    do {
      for (pxVar4 = members->type;
          (pxVar4 != (xmlSchemaTypePtr)0x0 && (pxVar4->type != XML_SCHEMA_TYPE_BASIC));
          pxVar4 = pxVar4->baseType) {
        if (pxVar4 == ctxType) {
          xmlSchemaPCustomErrExt
                    (pctxt,XML_SCHEMAP_SRC_SIMPLE_TYPE_4,(xmlSchemaBasicItemPtr)ctxType,
                     (xmlNodePtr)0x0,"The union type definition is circular",(xmlChar *)0x0,
                     (xmlChar *)0x0,(xmlChar *)0x0);
          return 0xbbb;
        }
        if ((pxVar4->flags & 0x10080U) == 0x80) {
          pxVar4->flags = pxVar4->flags | 0x10000;
          pxVar3 = pxVar4;
          do {
            if (pxVar3->type != XML_SCHEMA_TYPE_SIMPLE) break;
            members_00 = pxVar3->memberTypes;
            if (members_00 != (xmlSchemaTypeLinkPtr)0x0) goto LAB_001be44b;
            pxVar3 = pxVar3->baseType;
          } while (pxVar3 != (xmlSchemaTypePtr)0x0);
          members_00 = (xmlSchemaTypeLinkPtr)0x0;
LAB_001be44b:
          iVar2 = xmlSchemaCheckUnionTypeDefCircularRecur(pctxt,ctxType,members_00);
          pbVar1 = (byte *)((long)&pxVar4->flags + 2);
          *pbVar1 = *pbVar1 ^ 1;
          if (iVar2 != 0) {
            return iVar2;
          }
        }
      }
      members = members->next;
    } while (members != (_xmlSchemaTypeLink *)0x0);
  }
  return 0;
}

Assistant:

static int
xmlSchemaCheckUnionTypeDefCircularRecur(xmlSchemaParserCtxtPtr pctxt,
					xmlSchemaTypePtr ctxType,
					xmlSchemaTypeLinkPtr members)
{
    xmlSchemaTypeLinkPtr member;
    xmlSchemaTypePtr memberType;

    member = members;
    while (member != NULL) {
	memberType = member->type;
	while ((memberType != NULL) &&
	    (memberType->type != XML_SCHEMA_TYPE_BASIC)) {
	    if (memberType == ctxType) {
		xmlSchemaPCustomErr(pctxt,
		    XML_SCHEMAP_SRC_SIMPLE_TYPE_4,
		    WXS_BASIC_CAST ctxType, NULL,
		    "The union type definition is circular", NULL);
		return (XML_SCHEMAP_SRC_SIMPLE_TYPE_4);
	    }
	    if ((WXS_IS_UNION(memberType)) &&
		((memberType->flags & XML_SCHEMAS_TYPE_MARKED) == 0))
	    {
		int res;
		memberType->flags |= XML_SCHEMAS_TYPE_MARKED;
		res = xmlSchemaCheckUnionTypeDefCircularRecur(pctxt,
		    ctxType,
		    xmlSchemaGetUnionSimpleTypeMemberTypes(memberType));
		memberType->flags ^= XML_SCHEMAS_TYPE_MARKED;
		if (res != 0)
		    return(res);
	    }
	    memberType = memberType->baseType;
	}
	member = member->next;
    }
    return(0);
}